

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::BuildNodeHierarchy
          (CrateReader *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *pathIndexes,
          vector<int,_std::allocator<int>_> *elementTokenIndexes,
          vector<int,_std::allocator<int>_> *jumps,vector<bool,_std::allocator<bool>_> *visit_table,
          size_t _curIndex,int64_t _parentNodeIndex)

{
  Node *pNVar1;
  ulong *puVar2;
  long *plVar3;
  uint uVar4;
  pointer puVar5;
  pointer pPVar6;
  pointer pNVar7;
  _Bit_type *p_Var8;
  uint *puVar9;
  void *pvVar10;
  pointer puVar11;
  pointer piVar12;
  vector<int,_std::allocator<int>_> *pvVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  ostream *poVar17;
  long lVar18;
  int iVar19;
  long *plVar20;
  char *pcVar21;
  long *plVar22;
  ulong uVar23;
  long *plVar24;
  int64_t parentNodeIndex;
  size_t subtreeEndIdx;
  string name;
  Node node;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> startIndexStack;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> endIndexStack;
  stack<long,_std::deque<long,_std::allocator<long>_>_> parentNodeIndexStack;
  ostringstream ss_e_7;
  long *local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_520;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_518;
  vector<bool,_std::allocator<bool>_> *local_510;
  long *local_508;
  long *local_500 [2];
  long local_4f0 [2];
  string local_4e0;
  undefined1 local_4c0 [8];
  pointer local_4b8;
  pointer puStack_4b0;
  pointer local_4a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_4a0;
  undefined1 local_468 [32];
  _Alloc_hider local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  _Alloc_hider local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  _Alloc_hider local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  _Alloc_hider local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  _Alloc_hider local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8 [2];
  Path local_398;
  vector<int,_std::allocator<int>_> *local_2c8;
  Path *local_2c0;
  size_t local_2b8;
  ulong local_2b0;
  long local_2a8;
  long *local_2a0;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_298;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_248;
  _Deque_base<long,_std::allocator<long>_> local_1f8;
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  uVar16 = 0;
  local_510 = visit_table;
  ::std::_Deque_base<long,_std::allocator<long>_>::_M_initialize_map(&local_1f8,0);
  local_298._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
  local_298._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_298._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
  local_298._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
  local_298._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_298._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_298._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
  local_298._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_298._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_298._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_298,0)
  ;
  local_248._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
  local_248._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
  local_248._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
  local_248._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_248,0)
  ;
  local_2b8 = (this->_config).maxPathIndicesDecodeIteration;
  local_578 = (long *)_parentNodeIndex;
  if (local_2b8 != 0) {
    plVar22 = (long *)(((long)(pathIndexes->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pathIndexes->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2) - 1);
    local_2c0 = &local_398;
    local_570 = &local_398._element.field_2;
    local_568 = &local_398._variant_part_str.field_2;
    local_560 = &local_398._variant_selection_part.field_2;
    local_558 = &local_398._variant_part.field_2;
    local_550 = &local_398._prop_part.field_2;
    local_548 = &local_398._prim_part.field_2;
    local_540 = local_3b8;
    local_538 = &local_3d8;
    local_530 = &local_3f8;
    local_528 = &local_418;
    local_520 = &local_438;
    uVar16 = 0;
    local_518 = pathIndexes;
    do {
      pvVar13 = jumps;
      if (_curIndex < (long *)((long)plVar22 + 1U)) {
        while (local_2a0 = plVar22, local_2c8 = pvVar13, local_578 == (long *)0xffffffffffffffff) {
          if ((long *)_curIndex != (long *)0x0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
            poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x12eb);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pcVar21 = "TODO: Multiple root nodes.";
            goto LAB_001c7e66;
          }
          puVar9 = (pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
              .super__Vector_impl_data._M_finish == puVar9) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
            iVar19 = 0x12ef;
            goto LAB_001c7f00;
          }
          uVar4 = *puVar9;
          uVar23 = (ulong)uVar4;
          pPVar6 = (this->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar15 = ((long)(this->_paths).
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pPVar6 >> 4) *
                   0x4ec4ec4ec4ec4ec5;
          if (uVar15 < uVar23 || uVar15 - uVar23 == 0) {
            local_508 = (long *)_curIndex;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
            poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x12f4);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,"PathIndex out-of-range.",0x17);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"\n",1);
            ::std::__cxx11::stringbuf::str();
            goto LAB_001c714b;
          }
          uVar15 = ((long)(this->_nodes).
                          super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_nodes).
                          super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1041041041041041;
          if (uVar15 < uVar23 || uVar15 - uVar23 == 0) {
            local_508 = (long *)_curIndex;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
            poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x12f8);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pcVar21 = "PathIndex out-of-range.";
            lVar18 = 0x17;
LAB_001c7104:
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,pcVar21,lVar18);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"\n",1);
            ::std::__cxx11::stringbuf::str();
            goto LAB_001c714b;
          }
          p_Var8 = (local_510->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          if ((ulong)(local_510->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(local_510->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var8
              ) * 8 <= uVar23) {
            local_508 = (long *)_curIndex;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
            poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x12fd);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pcVar21 = "[InternalError] out-of-range.";
            lVar18 = 0x1d;
            goto LAB_001c7104;
          }
          if ((p_Var8[uVar4 >> 6] >> (uVar23 & 0x3f) & 1) != 0) {
            local_508 = (long *)_curIndex;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
            poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x1301);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pcVar21 = "Circular referencing detected. Invalid Prim tree representation.";
            lVar18 = 0x40;
            goto LAB_001c7104;
          }
          local_508 = (long *)_curIndex;
          Node::Node((Node *)local_4c0,-1,pPVar6 + uVar23);
          pNVar7 = (this->_nodes).
                   super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pNVar7[uVar23]._parent = (int64_t)local_4c0;
          pvVar10 = pNVar7[uVar23]._children.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar11 = *(pointer *)
                     ((long)&pNVar7[uVar23]._children.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 0x10);
          pNVar7[uVar23]._children.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_start = local_4b8;
          *(pointer *)
           ((long)&pNVar7[uVar23]._children.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data + 8) = puStack_4b0;
          *(pointer *)
           ((long)&pNVar7[uVar23]._children.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
               = local_4a8;
          local_4b8 = (pointer)0x0;
          puStack_4b0 = (pointer)0x0;
          local_4a8 = (pointer)0x0;
          if (pvVar10 != (void *)0x0) {
            operator_delete(pvVar10,(long)puVar11 - (long)pvVar10);
          }
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::_M_move_assign(&pNVar7[uVar23]._primChildren._M_h,&local_4a0);
          Path::operator=(&pNVar7[uVar23]._path,(Path *)local_468);
          Path::operator=(&pNVar7[uVar23]._elemPath,local_2c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._element._M_dataplus._M_p != local_570) {
            operator_delete(local_398._element._M_dataplus._M_p,
                            local_398._element.field_2._M_allocated_capacity + 1);
          }
          jumps = local_2c8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._variant_part_str._M_dataplus._M_p != local_568) {
            operator_delete(local_398._variant_part_str._M_dataplus._M_p,
                            local_398._variant_part_str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._variant_selection_part._M_dataplus._M_p != local_560) {
            operator_delete(local_398._variant_selection_part._M_dataplus._M_p,
                            local_398._variant_selection_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._variant_part._M_dataplus._M_p != local_558) {
            operator_delete(local_398._variant_part._M_dataplus._M_p,
                            local_398._variant_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._prop_part._M_dataplus._M_p != local_550) {
            operator_delete(local_398._prop_part._M_dataplus._M_p,
                            local_398._prop_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._prim_part._M_dataplus._M_p != local_548) {
            operator_delete(local_398._prim_part._M_dataplus._M_p,
                            local_398._prim_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_p != local_540) {
            operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_p != local_538) {
            operator_delete(local_3e8._M_p,local_3d8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_p != local_530) {
            operator_delete(local_408._M_p,local_3f8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_p != local_528) {
            operator_delete(local_428._M_p,local_418._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_p != local_520) {
            operator_delete(local_448._M_p,local_438._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
            operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
          }
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_4a0);
          if (local_4b8 != (pointer)0x0) {
            operator_delete(local_4b8,(long)local_4a8 - (long)local_4b8);
          }
          puVar2 = (local_510->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar4 >> 6);
          *puVar2 = *puVar2 | 1L << ((byte)uVar4 & 0x3f);
          local_578 = (long *)0x0;
          pathIndexes = local_518;
          plVar24 = local_508;
LAB_001c6a37:
          piVar12 = (jumps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          plVar22 = (long *)((long)(jumps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar12 >> 2);
          if (plVar22 <= plVar24) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
            poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x134f);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pcVar21 = "Index is out-of-range";
LAB_001c7dac:
            lVar18 = 0x15;
            goto LAB_001c7005;
          }
          iVar19 = piVar12[(long)plVar24];
          if ((long)iVar19 < 1) {
            if (iVar19 == -1) goto LAB_001c6aa8;
          }
          else {
            plVar3 = (long *)((long)plVar24 + (long)iVar19);
            plVar20 = plVar3;
            if (plVar22 <= plVar3) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
              poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x135a);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
              pcVar21 = "jump index corrupted.";
              goto LAB_001c7dac;
            }
            while (local_4e0._M_dataplus._M_p = (pointer)plVar3, -2 < piVar12[(long)plVar20]) {
              plVar20 = (long *)((long)plVar20 + 1);
              if (plVar22 <= plVar20) {
                local_500[0] = plVar22;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
                poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x136f);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                pcVar21 = "jump indices seems corrupted.";
                goto LAB_001c7000;
              }
            }
            local_500[0] = plVar20;
            if (plVar3 <= plVar20) {
              if (iVar19 != 1) {
                local_4c0 = (undefined1  [8])((long)plVar24 + 1);
                if (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_298._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_push_back_aux<unsigned_long>
                            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                             (unsigned_long *)local_4c0);
                }
                else {
                  *local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       (unsigned_long)local_4c0;
                  local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_298._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
                local_4c0 = (undefined1  [8])((long)plVar3 - 1);
                if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_248._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_push_back_aux<unsigned_long>
                            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_248,
                             (unsigned_long *)local_4c0);
                }
                else {
                  *local_248._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       (unsigned_long)local_4c0;
                  local_248._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_248._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
                local_4c0 = (undefined1  [8])plVar24;
                if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  ::std::deque<long,_std::allocator<long>_>::_M_push_back_aux<long>
                            ((deque<long,_std::allocator<long>_> *)&local_1f8,(long *)local_4c0);
                }
                else {
                  *local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (long)plVar24;
                  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
              }
              if (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_298._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
                _M_push_back_aux<unsigned_long_const&>
                          ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_298,
                           (unsigned_long *)&local_4e0);
              }
              else {
                *local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     (unsigned_long)local_4e0._M_dataplus._M_p;
                local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_298._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_248._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
                _M_push_back_aux<unsigned_long_const&>
                          ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_248,
                           (unsigned_long *)local_500);
              }
              else {
                *local_248._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     (unsigned_long)local_500[0];
                local_248._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_248._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                ::std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                          ((deque<long,std::allocator<long>> *)&local_1f8,(long *)&local_578);
              }
              else {
                *local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (long)local_578;
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              uVar16 = uVar16 + 1;
              goto LAB_001c6c8e;
            }
LAB_001c6aa8:
            local_578 = plVar24;
          }
          _curIndex = (long)plVar24 + 1;
          pvVar13 = local_2c8;
          plVar22 = local_2a0;
          if (plVar24 == local_2a0) goto LAB_001c6c8e;
        }
        puVar5 = (pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        plVar22 = (long *)((long)(pathIndexes->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2);
        if ((long)local_578 < (long)plVar22) {
          if (_curIndex < plVar22) {
            uVar4 = puVar5[_curIndex];
            uVar23 = (ulong)uVar4;
            pPVar6 = (this->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar15 = ((long)(this->_paths).
                            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pPVar6 >> 4) *
                     0x4ec4ec4ec4ec4ec5;
            if (uVar15 < uVar23 || uVar15 - uVar23 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
              iVar19 = 0x131b;
            }
            else {
              pNVar7 = (this->_nodes).
                       super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar15 = ((long)(this->_nodes).
                              super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 3) *
                       -0x1041041041041041;
              if (uVar23 <= uVar15 && uVar15 - uVar23 != 0) {
                p_Var8 = (local_510->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                if ((ulong)(local_510->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    ((long)(local_510->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)p_Var8) * 8 <= uVar23) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c0,"[Crate]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x1324)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  pcVar21 = "[InternalError] out-of-range.";
LAB_001c7000:
                  lVar18 = 0x1d;
                  goto LAB_001c7005;
                }
                local_2b0 = uVar16;
                if ((p_Var8[uVar4 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
                  if (pNVar7[uVar23]._parent != -2) {
                    local_508 = (long *)_curIndex;
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                               ,0x56);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c0,"[Crate]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c0,"():",3);
                    poVar17 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_4c0,0x132e);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                    pcVar21 = "???: Maybe corrupted path hierarchy?.";
                    lVar18 = 0x25;
                    goto LAB_001c7104;
                  }
                  local_2a8 = uVar23 * 0xd0;
                  local_508 = (long *)_curIndex;
                  Node::Node((Node *)local_4c0,(int64_t)local_578,pPVar6 + uVar23);
                  pNVar7 = (this->_nodes).
                           super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pNVar1 = pNVar7 + uVar23;
                  pNVar7 = pNVar7 + uVar23;
                  pNVar7->_parent = (int64_t)local_4c0;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &pNVar7->_children,
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4b8);
                  if ((Node *)local_4c0 != pNVar1) {
                    ::std::
                    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    ::
                    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                *)&pNVar1->_primChildren,&local_4a0);
                  }
                  Path::operator=(&pNVar1->_path,(Path *)local_468);
                  Path::operator=(&pNVar1->_elemPath,local_2c0);
                  puVar2 = (local_510->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (uVar4 >> 6);
                  *puVar2 = *puVar2 | 1L << ((byte)uVar4 & 0x3f);
                  pPVar6 = (this->_elemPaths).
                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  uVar16 = ((long)(this->_elemPaths).
                                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6 >> 4) *
                           0x4ec4ec4ec4ec4ec5;
                  if (uVar16 < uVar23 || uVar16 - uVar23 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                               ,0x56);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"[Crate]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"BuildNodeHierarchy",0x12);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"():",3);
                    poVar17 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1a8,0x1337);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"PathIndex out-of-range.",0x17);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\n",1);
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append
                              ((char *)&this->_err,(ulong)local_4e0._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
                      operator_delete(local_4e0._M_dataplus._M_p,
                                      local_4e0.field_2._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    ::std::ios_base::~ios_base(local_138);
                  }
                  else {
                    Path::full_path_name_abi_cxx11_
                              (&local_4e0,
                               (Path *)((long)&(pPVar6->_prim_part)._M_dataplus._M_p + local_2a8));
                    pathIndexes = local_518;
                    puVar5 = (local_518->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    if (local_578 <
                        (long *)((long)(local_518->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >>
                                2)) {
                      uVar16 = (ulong)puVar5[(long)local_578];
                      pNVar7 = (this->_nodes).
                               super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      uVar15 = ((long)(this->_nodes).
                                      super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 3
                               ) * -0x1041041041041041;
                      if (uVar15 < uVar16 || uVar15 - uVar16 == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                   ,0x56);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"[Crate]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"BuildNodeHierarchy",0x12);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"():",3);
                        poVar17 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)local_1a8,0x1345);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                        pcVar21 = "PathIndex out-of-range.";
                        lVar18 = 0x17;
                      }
                      else {
                        bVar14 = Node::AddChildren(pNVar7 + uVar16,&local_4e0,uVar23);
                        if (bVar14) {
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
                            operator_delete(local_4e0._M_dataplus._M_p,
                                            local_4e0.field_2._M_allocated_capacity + 1);
                          }
                          uVar16 = local_2b0;
                          jumps = local_2c8;
                          plVar24 = local_508;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._element._M_dataplus._M_p != local_570) {
                            operator_delete(local_398._element._M_dataplus._M_p,
                                            local_398._element.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._variant_part_str._M_dataplus._M_p != local_568) {
                            operator_delete(local_398._variant_part_str._M_dataplus._M_p,
                                            local_398._variant_part_str.field_2.
                                            _M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._variant_selection_part._M_dataplus._M_p != local_560) {
                            operator_delete(local_398._variant_selection_part._M_dataplus._M_p,
                                            local_398._variant_selection_part.field_2.
                                            _M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._variant_part._M_dataplus._M_p != local_558) {
                            operator_delete(local_398._variant_part._M_dataplus._M_p,
                                            local_398._variant_part.field_2._M_allocated_capacity +
                                            1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._prop_part._M_dataplus._M_p != local_550) {
                            operator_delete(local_398._prop_part._M_dataplus._M_p,
                                            local_398._prop_part.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._prim_part._M_dataplus._M_p != local_548) {
                            operator_delete(local_398._prim_part._M_dataplus._M_p,
                                            local_398._prim_part.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3c8._M_p != local_540) {
                            operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3e8._M_p != local_538) {
                            operator_delete(local_3e8._M_p,local_3d8._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_408._M_p != local_530) {
                            operator_delete(local_408._M_p,local_3f8._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_428._M_p != local_528) {
                            operator_delete(local_428._M_p,local_418._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_448._M_p != local_520) {
                            operator_delete(local_448._M_p,local_438._M_allocated_capacity + 1);
                          }
                          if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                            operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
                          }
                          ::std::
                          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          ::~_Hashtable(&local_4a0);
                          if (local_4b8 != (pointer)0x0) {
                            operator_delete(local_4b8,(long)local_4a8 - (long)local_4b8);
                          }
                          goto LAB_001c6a37;
                        }
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                   ,0x56);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"[Crate]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"BuildNodeHierarchy",0x12);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"():",3);
                        poVar17 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)local_1a8,0x134a);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                        pcVar21 = "Invalid path index.";
                        lVar18 = 0x13;
                      }
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"[Crate]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"BuildNodeHierarchy",0x12);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"():",3);
                      poVar17 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1a8,0x1340);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                      pcVar21 = "ParentNodeIdx out-of-range.";
                      lVar18 = 0x1b;
                    }
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,pcVar21,lVar18);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\n",1);
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_500[0]);
                    if (local_500[0] != local_4f0) {
                      operator_delete(local_500[0],local_4f0[0] + 1);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    ::std::ios_base::~ios_base(local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
                      operator_delete(local_4e0._M_dataplus._M_p,
                                      local_4e0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._element._M_dataplus._M_p != local_570) {
                    operator_delete(local_398._element._M_dataplus._M_p,
                                    local_398._element.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._variant_part_str._M_dataplus._M_p != local_568) {
                    operator_delete(local_398._variant_part_str._M_dataplus._M_p,
                                    local_398._variant_part_str.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._variant_selection_part._M_dataplus._M_p != local_560) {
                    operator_delete(local_398._variant_selection_part._M_dataplus._M_p,
                                    local_398._variant_selection_part.field_2._M_allocated_capacity
                                    + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._variant_part._M_dataplus._M_p != local_558) {
                    operator_delete(local_398._variant_part._M_dataplus._M_p,
                                    local_398._variant_part.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._prop_part._M_dataplus._M_p != local_550) {
                    operator_delete(local_398._prop_part._M_dataplus._M_p,
                                    local_398._prop_part.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._prim_part._M_dataplus._M_p != local_548) {
                    operator_delete(local_398._prim_part._M_dataplus._M_p,
                                    local_398._prim_part.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c8._M_p != local_540) {
                    operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e8._M_p != local_538) {
                    operator_delete(local_3e8._M_p,local_3d8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_p != local_530) {
                    operator_delete(local_408._M_p,local_3f8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_428._M_p != local_528) {
                    operator_delete(local_428._M_p,local_418._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_448._M_p != local_520) {
                    operator_delete(local_448._M_p,local_438._M_allocated_capacity + 1);
                  }
                  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                    operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
                  }
                  ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::~_Hashtable(&local_4a0);
                  if (local_4b8 != (pointer)0x0) {
                    operator_delete(local_4b8,(long)local_4a8 - (long)local_4b8);
                  }
                  goto LAB_001c7191;
                }
                local_508 = (long *)_curIndex;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
                poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x1328);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                pcVar21 = "Circular referencing detected. Invalid Prim tree representation.";
                lVar18 = 0x40;
                goto LAB_001c7005;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
              iVar19 = 0x131f;
            }
            poVar17 = (ostream *)::std::ostream::operator<<(local_4c0,iVar19);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pcVar21 = "PathIndex out-of-range.";
            lVar18 = 0x17;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
            iVar19 = 0x1313;
LAB_001c7f00:
            poVar17 = (ostream *)::std::ostream::operator<<(local_4c0,iVar19);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pcVar21 = "Index out-of-range.";
            lVar18 = 0x13;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
          poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x130f);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
          pcVar21 = "Parent Index out-of-range.";
LAB_001c7e66:
          lVar18 = 0x1a;
        }
LAB_001c7005:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,pcVar21,lVar18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        goto LAB_001c714b;
      }
LAB_001c6c8e:
      if (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_298._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      if (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_298._M_impl.super__Deque_impl_data._M_finish._M_first) {
        _curIndex = local_298._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
        operator_delete(local_298._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_298._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_298._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_298._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_298._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_298._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_298._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_298._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        _curIndex = local_298._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_298._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_248._M_impl.super__Deque_impl_data._M_finish._M_first) {
        plVar22 = (long *)local_248._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
        operator_delete(local_248._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_248._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_248._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_248._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_248._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_248._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_248._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        pathIndexes = local_518;
        local_248._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_248._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        plVar22 = (long *)local_248._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_248._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_248._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        local_578 = (long *)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
        operator_delete(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        pathIndexes = local_518;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_578 = (long *)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < local_2b8);
  }
  bVar14 = true;
  if (local_2b8 <= uVar16) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c0,"BuildNodeHierarchy",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
    poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x13a3);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c0,"PathIndex tree Too deep.",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"\n",1);
    ::std::__cxx11::stringbuf::str();
LAB_001c714b:
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1a8[0]);
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0],local_198[0] + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
    ::std::ios_base::~ios_base((ios_base *)(local_468 + 0x18));
LAB_001c7191:
    bVar14 = false;
  }
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_248);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_298);
  ::std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_1f8);
  return bVar14;
}

Assistant:

bool CrateReader::BuildNodeHierarchy(
    std::vector<uint32_t> const &pathIndexes,
    std::vector<int32_t> const &elementTokenIndexes,
    std::vector<int32_t> const &jumps,
    std::vector<bool> &visit_table, /* inout */
    size_t _curIndex,
    int64_t _parentNodeIndex) {

  (void)elementTokenIndexes;

  std::stack<int64_t> parentNodeIndexStack;
  std::stack<size_t> startIndexStack;
  std::stack<size_t> endIndexStack;

  size_t nIter = 0;
  const size_t maxIter = _config.maxPathIndicesDecodeIteration;

  size_t startIndex = _curIndex;
  size_t endIndex = pathIndexes.size() - 1;
  int64_t parentNodeIndex = _parentNodeIndex;

  // NOTE: Need to indirectly lookup index through pathIndexes[] when accessing
  // `_nodes`
  while (nIter < maxIter) {

    for (size_t thisIndex = startIndex; thisIndex < (endIndex + 1); thisIndex++) {
      if (parentNodeIndex == -1) {
        // root node.
        // Assume single root node in the scene.
        //assert(thisIndex == 0);
        if (thisIndex != 0) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "TODO: Multiple root nodes.");
        }

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Index out-of-range.");
        }

        size_t pathIdx = pathIndexes[thisIndex];
        if (pathIdx >= _paths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= visit_table.size()) {
          // This should not be happan though
          PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] out-of-range.");
        }

        if (visit_table[pathIdx]) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Circular referencing detected. Invalid Prim tree representation.");
        }

        _nodes[pathIdx] = Node(parentNodeIndex, _paths[pathIdx]);
        visit_table[pathIdx] = true;

        parentNodeIndex = int64_t(thisIndex);

      } else {
        //if (parentNodeIndex >= int64_t(_nodes.size())) {
        //  PUSH_ERROR_AND_RETURN_TAG(kTag, "Parent Index out-of-range.");
        //}

        if (parentNodeIndex >= int64_t(pathIndexes.size())) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Parent Index out-of-range.");
        }

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Index out-of-range.");
        }

        DCOUT("Hierarchy. parent[" << pathIndexes[size_t(parentNodeIndex)]
                                   << "].add_child = " << pathIndexes[thisIndex]);

        size_t pathIdx = pathIndexes[thisIndex];
        if (pathIdx >= _paths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= visit_table.size()) {
          // This should not be happan though
          PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] out-of-range.");
        }

        if (visit_table[pathIdx]) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Circular referencing detected. Invalid Prim tree representation.");
        }


        // Ensure parent is not set yet.
        if (_nodes[pathIdx].GetParent() != -2) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "???: Maybe corrupted path hierarchy?.");
        }

        Node node(parentNodeIndex, _paths[pathIdx]);
        _nodes[pathIdx] = node;

        visit_table[pathIdx] = true;

        if (pathIdx >= _elemPaths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        //std::string name = _paths[pathIndexes[thisIndex]].local_path_name();
        std::string name = _elemPaths[pathIdx].full_path_name();
        DCOUT("childName = " << name);

        size_t parentNodeIdx = size_t(parentNodeIndex);
        if (parentNodeIdx >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "ParentNodeIdx out-of-range.");
        }

        size_t parentPathIdx = pathIndexes[parentNodeIdx];
        if (parentPathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (!_nodes[parentPathIdx].AddChildren(
            name, pathIdx)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid path index.");
        }
      }

      if (thisIndex >= jumps.size()) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Index is out-of-range");
      }

      bool hasChild = (jumps[thisIndex] > 0) || (jumps[thisIndex] == -1);
      bool hasSibling = (jumps[thisIndex] >= 0);

      if (hasChild) {
        if (hasSibling) {
          auto siblingIndex = thisIndex + size_t(jumps[thisIndex]);

          if (siblingIndex >= jumps.size()) {
            PUSH_ERROR_AND_RETURN("jump index corrupted.");
          }

          // Find subtree end.
          size_t subtreeStartIdx = siblingIndex;
          size_t subtreeIdx = subtreeStartIdx;

          for (; subtreeIdx < jumps.size(); subtreeIdx++) {

            bool has_child = (jumps[subtreeIdx] > 0) || (jumps[subtreeIdx] == -1);
            bool has_sibling = (jumps[subtreeIdx] >= 0);

            if (has_child || has_sibling) {
              continue;
            }
            break;
          }

          size_t subtreeEndIdx = subtreeIdx;
          if (subtreeEndIdx >= jumps.size()) {
            // Guess corrupted.
            PUSH_ERROR_AND_RETURN("jump indices seems corrupted.");
          }

          DCOUT("subtree startIdx " << subtreeStartIdx << ", subtree endIndex " << subtreeEndIdx);

          if (subtreeEndIdx >= subtreeStartIdx) {

            // index range after traversing subtree
            if (jumps[thisIndex] > 1) {
                startIndexStack.push(thisIndex+1);
                // jumps should be always positive, so no siblingIndex < thisIndex
                endIndexStack.push(siblingIndex-1); // endIndex is inclusive so subtract 1.
                parentNodeIndexStack.push(int64_t(thisIndex));
            }

            startIndexStack.push(subtreeStartIdx);
            endIndexStack.push(subtreeEndIdx);
            parentNodeIndexStack.push(parentNodeIndex);

            DCOUT("stack size: " << startIndexStack.size());

            nIter++;

            break; // goto `(A)`
          }

        }
        // Have a child (may have also had a sibling). Reset parent node index
        parentNodeIndex = int64_t(thisIndex);
        DCOUT("parentNodeIndex = " << parentNodeIndex);
      }
    }

    // (A)

    if (startIndexStack.empty()) {
      break; // end traversal
    }

    startIndex = startIndexStack.top();
    startIndexStack.pop();

    endIndex = endIndexStack.top();
    endIndexStack.pop();

    parentNodeIndex = parentNodeIndexStack.top();
    parentNodeIndexStack.pop();

    nIter++;
  }

  if (nIter >= maxIter) {
    PUSH_ERROR_AND_RETURN("PathIndex tree Too deep.");
  }

  return true;
}